

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vod_common.cpp
# Opt level: O1

string * floatToTime_abi_cxx11_(string *__return_storage_ptr__,double time,char msSeparator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  int msec;
  int sec;
  int min;
  int hour;
  ostringstream str;
  string local_238;
  string local_218;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c4;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1c4 = (int)time / 0xe10;
  local_1f0 = (int)time % 0xe10;
  local_1ec = local_1f0 / 0x3c;
  local_1f0 = local_1f0 % 0x3c;
  local_1f4 = (int)((time - (double)(int)time) * 1000.0);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  int32ToStr_abi_cxx11_(&local_218,&local_1c4);
  strPadLeft(&local_238,&local_218,2,'0');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length);
  local_1e8._M_dataplus._M_p._0_1_ = 0x3a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1e8,1);
  paVar1 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  int32ToStr_abi_cxx11_(&local_218,&local_1ec);
  strPadLeft(&local_238,&local_218,2,'0');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length);
  local_1e8._M_dataplus._M_p._0_1_ = 0x3a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1e8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  int32ToStr_abi_cxx11_(&local_218,&local_1f0);
  strPadLeft(&local_238,&local_218,2,'0');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length);
  local_1e8._M_dataplus._M_p._0_1_ = msSeparator;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1e8,1);
  int32ToStr_abi_cxx11_(&local_1c0,&local_1f4);
  strPadLeft(&local_1e8,&local_1c0,3,'0');
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                     (char)local_1e8._M_dataplus._M_p),local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,(char)local_1e8._M_dataplus._M_p) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1e8._M_dataplus._M_p._1_7_,(char)local_1e8._M_dataplus._M_p),
                    local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string floatToTime(const double time, const char msSeparator)
{
    int iTime = static_cast<int>(time);
    const int hour = iTime / 3600;
    iTime -= hour * 3600;
    const int min = iTime / 60;
    iTime -= min * 60;
    const int sec = iTime;
    const int msec = static_cast<int>((time - static_cast<int>(time)) * 1000.0);
    std::ostringstream str;
    str << strPadLeft(int32ToStr(hour), 2, '0') << ':';
    str << strPadLeft(int32ToStr(min), 2, '0') << ':';
    str << strPadLeft(int32ToStr(sec), 2, '0') << msSeparator << strPadLeft(int32ToStr(msec), 3, '0');
    return str.str();
}